

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_device.c
# Opt level: O2

int amqp_device_send_twin_update_async
              (AMQP_DEVICE_HANDLE handle,CONSTBUFFER_HANDLE data,
              DEVICE_SEND_TWIN_UPDATE_COMPLETE_CALLBACK on_send_twin_update_complete_callback,
              void *context)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  undefined8 *context_00;
  AMQP_DEVICE_INSTANCE_conflict *instance;
  
  if (handle == (AMQP_DEVICE_HANDLE)0x0 || data == (CONSTBUFFER_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x5fb;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                ,"amqp_device_send_twin_update_async",0x5fa,1,
                "Invalid argument (handle=%p, data=%p)",handle,data);
    }
  }
  else {
    context_00 = (undefined8 *)malloc(0x10);
    if (context_00 == (undefined8 *)0x0) {
      p_Var2 = xlogging_get_log_function();
      iVar1 = 0x605;
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                  ,"amqp_device_send_twin_update_async",0x604,1,
                  "Cannot send twin update (failed creating TWIN context)");
      }
    }
    else {
      *context_00 = on_send_twin_update_complete_callback;
      context_00[1] = context;
      iVar1 = twin_messenger_report_state_async
                        (handle->twin_messenger_handle,data,on_report_state_complete_callback,
                         context_00);
      if (iVar1 == 0) {
        iVar1 = 0;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                    ,"amqp_device_send_twin_update_async",0x60e,1,
                    "Cannot send twin update (failed creating TWIN messenger)");
        }
        free(context_00);
        iVar1 = 0x610;
      }
    }
  }
  return iVar1;
}

Assistant:

int amqp_device_send_twin_update_async(AMQP_DEVICE_HANDLE handle, CONSTBUFFER_HANDLE data, DEVICE_SEND_TWIN_UPDATE_COMPLETE_CALLBACK on_send_twin_update_complete_callback, void* context)
{
    int result;

    if (handle == NULL || data == NULL)
    {
        LogError("Invalid argument (handle=%p, data=%p)", handle, data);
        result = MU_FAILURE;
    }
    else
    {
        AMQP_DEVICE_INSTANCE* instance = (AMQP_DEVICE_INSTANCE*)handle;
        DEVICE_SEND_TWIN_UPDATE_CONTEXT* twin_ctx;

        if ((twin_ctx = (DEVICE_SEND_TWIN_UPDATE_CONTEXT*)malloc(sizeof(DEVICE_SEND_TWIN_UPDATE_CONTEXT))) == NULL)
        {
            LogError("Cannot send twin update (failed creating TWIN context)");
            result = MU_FAILURE;
        }
        else
        {
            twin_ctx->on_send_twin_update_complete_callback = on_send_twin_update_complete_callback;
            twin_ctx->context = context;

            if (twin_messenger_report_state_async(instance->twin_messenger_handle, data, on_report_state_complete_callback, (const void*)twin_ctx) != 0)
            {
                LogError("Cannot send twin update (failed creating TWIN messenger)");
                free(twin_ctx);
                result = MU_FAILURE;
            }
            else
            {
                result = RESULT_OK;
            }
        }
    }

    return result;
}